

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  anon_enum_8 *__args_1;
  int *__args_2;
  __shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    __args_1 = (anon_enum_8 *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(int_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(int_*,_int,_int)>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(int_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(int_*,_int,_int)>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(int_*,_int,_int)>_*,_false>
                           + 0x28))();
    __args_2 = (int *)(**(code **)(*(long *)(this->current_).
                                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Tuple_impl<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Head_base<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_false>
                                            ._M_head_impl.impl_._M_t.
                                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                                            .
                                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>
                                  + 0x28))();
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                          .super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>_>.
                          super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl.impl_._M_t + 0x28))();
    std::
    make_shared<std::tuple<void(*)(int*,int,int),BLOCK_SIZE,int>,void(*const&)(int*,int,int),BLOCK_SIZE_const&,int_const&>
              ((_func_void_int_ptr_int_int **)&local_30,__args_1,__args_2);
    std::
    __shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->current_value_).
                 super___shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>,_(__gnu_cxx::_Lock_policy)2>
                ,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }